

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builder.cpp
# Opt level: O2

Error asmjit::BaseBuilder_newLabelInternal(BaseBuilder *self,uint32_t labelId)

{
  ZoneVector<asmjit::LabelNode_*> *this;
  uint uVar1;
  LabelNode *pLVar2;
  Error EVar3;
  LabelNode **ppLVar4;
  LabelNode *node;
  uint32_t local_2c;
  LabelNode *local_28;
  
  uVar1 = (self->_labelNodes).super_ZoneVectorBase._size;
  local_2c = labelId;
  if (labelId + 1 <= uVar1) {
    DebugUtils::assertionFailed
              ("/workspace/llm4binary/github/license_c_cmakelists/comsec-group[P]blacksmith/build_O2/_deps/asmjit-src/src/asmjit/core/builder.cpp"
               ,0x1d9,"self->_labelNodes.size() < labelId + 1");
  }
  this = &self->_labelNodes;
  EVar3 = ZoneVector<asmjit::LabelNode_*>::willGrow(this,&self->_allocator,labelId - uVar1);
  if (EVar3 == 0) {
    EVar3 = BaseBuilder::_newNodeT<asmjit::LabelNode,unsigned_int&>(self,&local_28,&local_2c);
    if (EVar3 == 0) {
      ZoneVector<asmjit::LabelNode_*>::resize(this,&self->_allocator,local_2c + 1);
      pLVar2 = local_28;
      ppLVar4 = ZoneVector<asmjit::LabelNode_*>::operator[](this,(ulong)local_2c);
      *ppLVar4 = pLVar2;
      local_28->_labelId = local_2c;
    }
    return EVar3;
  }
  EVar3 = BaseEmitter::reportError(&self->super_BaseEmitter,EVar3,(char *)0x0);
  return EVar3;
}

Assistant:

static Error BaseBuilder_newLabelInternal(BaseBuilder* self, uint32_t labelId) {
  ASMJIT_ASSERT(self->_labelNodes.size() < labelId + 1);

  uint32_t growBy = labelId - self->_labelNodes.size();
  Error err = self->_labelNodes.willGrow(&self->_allocator, growBy);

  if (ASMJIT_UNLIKELY(err))
    return self->reportError(err);

  LabelNode* node;
  ASMJIT_PROPAGATE(self->_newNodeT<LabelNode>(&node, labelId));

  self->_labelNodes.resize(&self->_allocator, labelId + 1);
  self->_labelNodes[labelId] = node;
  node->_labelId = labelId;
  return kErrorOk;
}